

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Buffers::MapRangeReadBitTest::iterate(MapRangeReadBitTest *this)

{
  GLbitfield GVar1;
  PFNGLNAMEDBUFFERSTORAGE p_Var2;
  PFNGLMAPNAMEDBUFFERRANGE p_Var3;
  PFNGLUNMAPNAMEDBUFFER p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ContextType ctxType;
  deUint32 dVar9;
  ulong in_RAX;
  undefined4 extraout_var;
  GLuint *pGVar11;
  undefined4 *puVar12;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  long lVar13;
  ulong uStack_38;
  GLuint buffer;
  long lVar10;
  
  uStack_38 = in_RAX;
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar8);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar6 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar5) || (bVar6)) {
    uStack_38 = uStack_38 & 0xffffffff;
    p_Var2 = *(PFNGLNAMEDBUFFERSTORAGE *)(lVar10 + 0xed8);
    this->m_pNamedBufferStorage = p_Var2;
    p_Var3 = *(PFNGLMAPNAMEDBUFFERRANGE *)(lVar10 + 0xd10);
    this->m_pMapNamedBufferRange = p_Var3;
    p_Var4 = *(PFNGLUNMAPNAMEDBUFFER *)(lVar10 + 0x1678);
    this->m_pUnmapNamedBuffer = p_Var4;
    if ((p_Var2 == (PFNGLNAMEDBUFFERSTORAGE)0x0) ||
       ((p_Var3 == (PFNGLMAPNAMEDBUFFERRANGE)0x0 || (p_Var4 == (PFNGLUNMAPNAMEDBUFFER)0x0)))) {
      puVar12 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar12 = 0;
      __cxa_throw(puVar12,&int::typeinfo,0);
    }
    bVar5 = true;
    for (lVar13 = 0; lVar13 != 0xc; lVar13 = lVar13 + 4) {
      (**(code **)(lVar10 + 0x3b8))(1,&buffer);
      dVar9 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar9,"glCreateBuffers failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x6a2);
      GVar1 = *(GLbitfield *)((long)&DAT_0170a36c + lVar13);
      (*this->m_pNamedBufferStorage)(buffer,0x30,s_reference,GVar1);
      dVar9 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar9,"glNamedBufferData failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x6a6);
      pGVar11 = (GLuint *)(*this->m_pMapNamedBufferRange)(buffer,0,0x18,GVar1);
      dVar9 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar9,"glMapNamedBufferRange failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x6aa);
      bVar6 = CompareWithReference(this,pGVar11,0,0x18);
      (*this->m_pUnmapNamedBuffer)(buffer);
      dVar9 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar9,"glUnmapNamedBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x6b1);
      pGVar11 = (GLuint *)(*this->m_pMapNamedBufferRange)(buffer,0x18,0x18,GVar1);
      dVar9 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar9,"glMapNamedBufferRange failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x6b6);
      bVar7 = CompareWithReference(this,pGVar11,0x18,0x18);
      (*this->m_pUnmapNamedBuffer)(buffer);
      dVar9 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar9,"glUnmapNamedBuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x6bd);
      if (buffer != 0) {
        (**(code **)(lVar10 + 0x438))(1);
        uStack_38 = uStack_38 & 0xffffffff;
      }
      bVar5 = (bVar6 && bVar5) && bVar7;
    }
    do {
      iVar8 = (**(code **)(lVar10 + 0x800))();
    } while (iVar8 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar5) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MapRangeReadBitTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	glw::GLuint buffer = 0;

	m_pNamedBufferStorage  = (PFNGLNAMEDBUFFERSTORAGE)gl.namedBufferStorage;
	m_pMapNamedBufferRange = (PFNGLMAPNAMEDBUFFERRANGE)gl.mapNamedBufferRange;
	m_pUnmapNamedBuffer	= (PFNGLUNMAPNAMEDBUFFER)gl.unmapNamedBuffer;

	try
	{
		if ((DE_NULL == m_pNamedBufferStorage) || (DE_NULL == m_pMapNamedBufferRange) ||
			(DE_NULL == m_pUnmapNamedBuffer))
		{
			throw 0;
		}

		glw::GLbitfield access_flags[] = { GL_MAP_READ_BIT, GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT,
										   GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT };

		glw::GLuint access_flags_count = sizeof(access_flags) / sizeof(access_flags[0]);

		for (glw::GLuint i = 0; i < access_flags_count; ++i)
		{
			/* Buffer creation. */
			gl.createBuffers(1, &buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

			/* Buffer's storage allocation and reference data upload. */
			m_pNamedBufferStorage(buffer, s_reference_size, s_reference, access_flags[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData failed.");

			/* Mapping with first half of named buffer. */
			glw::GLuint* data = (glw::GLuint*)m_pMapNamedBufferRange(buffer, 0, s_reference_size / 2, access_flags[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBufferRange failed.");

			/* Check with reference. */
			is_ok &= CompareWithReference(data, 0, s_reference_size / 2);

			/* Unmapping with new named buffer unmap function. */
			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");

			/* Mapping with second half of named buffer. */
			data = (glw::GLuint*)m_pMapNamedBufferRange(buffer, s_reference_size / 2, s_reference_size / 2,
														access_flags[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBufferRange failed.");

			/* Check with reference. */
			is_ok &= CompareWithReference(data, s_reference_size / 2, s_reference_size / 2);

			/* Unmapping with new named buffer unmap function. */
			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");

			/* Clean up. */
			if (buffer)
			{
				gl.deleteBuffers(1, &buffer);

				buffer = 0;
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}